

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

bool __thiscall
pybind11::detail::
object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
contains<char_const*&>
          (object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
           *this,char **item)

{
  bool bVar1;
  str_attr_accessor local_40;
  object local_20;
  char **local_18;
  char **item_local;
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_> *this_local
  ;
  
  local_18 = item;
  item_local = (char **)this;
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_>::attr
            (&local_40,
             (object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_>
              *)this,"__contains__");
  operator()((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
              *)&local_20,(char **)&local_40);
  bVar1 = object::cast<bool>(&local_20);
  object::~object(&local_20);
  accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_40);
  return bVar1;
}

Assistant:

bool object_api<D>::contains(T &&item) const {
    return attr("__contains__")(std::forward<T>(item)).template cast<bool>();
}